

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O3

CDAG * degenOrdered(CDAG *__return_storage_ptr__,CGraph *g)

{
  ulong uVar1;
  EdgeIdx *pEVar2;
  VertexIdx *pVVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  VertexIdx i;
  EdgeIdx *pEVar7;
  VertexIdx *pVVar8;
  EdgeIdx *pEVar9;
  VertexIdx *pVVar10;
  void *pvVar11;
  long *__first;
  void *pvVar12;
  void *pvVar13;
  void *__s;
  void *pvVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  EdgeIdx EVar23;
  EdgeIdx EVar24;
  ulong uVar25;
  
  uVar1 = g->nVertices;
  uVar25 = -(ulong)(uVar1 + 1 >> 0x3d != 0) | uVar1 * 8 + 8;
  pEVar7 = (EdgeIdx *)operator_new__(uVar25);
  uVar21 = -(ulong)(g->nEdges + 1U >> 0x3d != 0) | g->nEdges * 8 + 8U;
  pVVar8 = (VertexIdx *)operator_new__(uVar21);
  pEVar9 = (EdgeIdx *)operator_new__(uVar25);
  pVVar10 = (VertexIdx *)operator_new__(uVar21);
  uVar21 = -(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8;
  pvVar11 = operator_new__(uVar21);
  __first = (long *)operator_new__(uVar21);
  pvVar12 = operator_new__(uVar21);
  pvVar13 = operator_new__(uVar21);
  __s = operator_new__(uVar25);
  pvVar14 = operator_new__(uVar1);
  if ((long)uVar1 < 1) {
    if (uVar1 != 0) goto LAB_00103bcf;
LAB_00103e61:
    lVar15 = g->offsets[*__first + 1] - g->offsets[*__first];
LAB_00103e71:
    *(undefined8 *)((long)__s + lVar15 * 8) = 0;
  }
  else {
    pEVar2 = g->offsets;
    uVar21 = 0;
    do {
      __first[uVar21] = uVar21;
      *(undefined1 *)((long)pvVar14 + uVar21) = 0;
      *(EdgeIdx *)((long)pvVar12 + uVar21 * 8) = pEVar2[uVar21 + 1] - pEVar2[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar1 != uVar21);
LAB_00103bcf:
    lVar6 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<long*,long,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
              (__first,__first + uVar1,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<DegreeComp>)g);
    std::__final_insertion_sort<long*,__gnu_cxx::__ops::_Iter_comp_iter<DegreeComp>>
              (__first,__first + uVar1,(_Iter_comp_iter<DegreeComp>)g);
    lVar6 = g->nVertices;
    if (lVar6 < 1) goto LAB_00103e61;
    lVar15 = 0;
    do {
      *(long *)((long)pvVar13 + __first[lVar15] * 8) = lVar15;
      lVar15 = lVar15 + 1;
    } while (lVar6 != lVar15);
    pEVar2 = g->offsets;
    lVar15 = pEVar2[*__first + 1] - pEVar2[*__first];
    if (lVar6 < 1) goto LAB_00103e71;
    memset(__s,0xff,lVar6 * 8);
    *(undefined8 *)((long)__s + lVar15 * 8) = 0;
    lVar16 = 0;
    lVar17 = lVar15;
    do {
      lVar19 = pEVar2[__first[lVar16] + 1] - pEVar2[__first[lVar16]];
      if (lVar19 != lVar17) {
        *(long *)((long)__s + lVar19 * 8) = lVar16;
        lVar17 = lVar19;
      }
      lVar16 = lVar16 + 1;
    } while (lVar6 != lVar16);
    if (0 < lVar6) {
      lVar17 = 0;
      do {
        lVar16 = *(long *)((long)__s + lVar15 * 8);
        lVar19 = __first[lVar16];
        *(long *)((long)pvVar11 + lVar19 * 8) = lVar17;
        *(undefined1 *)((long)pvVar14 + lVar19) = 1;
        __first[lVar16] = -1;
        lVar20 = *(long *)((long)pvVar12 + __first[lVar16 + 1] * 8);
        lVar16 = lVar16 + 1;
        lVar22 = lVar15;
        if (lVar20 != *(long *)((long)pvVar12 + lVar19 * 8)) {
          lVar16 = -1;
          lVar22 = lVar20;
        }
        *(long *)((long)__s + lVar15 * 8) = lVar16;
        lVar16 = pEVar2[lVar19];
        lVar20 = pEVar2[lVar19 + 1];
        lVar15 = lVar22;
        if (lVar16 < lVar20) {
          pVVar3 = g->nbors;
          do {
            lVar22 = pVVar3[lVar16];
            if (*(char *)((long)pvVar14 + lVar22) == '\0') {
              lVar20 = *(long *)((long)pvVar12 + lVar22 * 8);
              lVar4 = *(long *)((long)__s + lVar20 * 8);
              lVar18 = __first[lVar4];
              if (lVar18 == -1) {
                printf(
                      "Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld"
                      );
                goto LAB_00103f1d;
              }
              __first[lVar4] = lVar22;
              lVar5 = *(long *)((long)pvVar13 + lVar22 * 8);
              __first[lVar5] = lVar18;
              *(long *)((long)pvVar13 + lVar18 * 8) = lVar5;
              *(long *)((long)pvVar13 + lVar22 * 8) = lVar4;
              lVar18 = lVar4 + 1;
              if (*(long *)((long)pvVar12 + __first[lVar4 + 1] * 8) != lVar20) {
                lVar18 = -1;
              }
              *(long *)((long)__s + lVar20 * 8) = lVar18;
              lVar18 = lVar20 + -1;
              *(long *)((long)pvVar12 + lVar22 * 8) = lVar18;
              if (*(long *)((long)__s + lVar20 * 8 + -8) == -1) {
                *(long *)((long)__s + lVar20 * 8 + -8) = lVar4;
              }
              if (lVar18 <= lVar15) {
                lVar15 = lVar18;
              }
              lVar20 = pEVar2[lVar19 + 1];
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 < lVar20);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar6);
      if (0 < lVar6) {
        lVar15 = 0;
        do {
          if (*(char *)((long)pvVar14 + lVar15) == '\0') {
            printf("Error in degeneracy removal. Vertex %lld not removed\n");
LAB_00103f1d:
            exit(1);
          }
          lVar15 = lVar15 + 1;
        } while (lVar6 != lVar15);
        lVar15 = 0;
        *pEVar7 = 0;
        *pEVar9 = 0;
        lVar17 = 0;
        if (0 < lVar6) {
          lVar19 = 0;
          lVar17 = 0;
          lVar15 = 0;
          lVar16 = 0;
          EVar23 = 0;
          EVar24 = *pEVar2;
          do {
            lVar20 = pEVar2[lVar19 + 1];
            if (EVar24 < lVar20) {
              pVVar3 = g->nbors;
              lVar22 = *(long *)((long)pvVar11 + lVar19 * 8);
              do {
                lVar4 = pVVar3[EVar24];
                if (lVar22 < *(long *)((long)pvVar11 + lVar4 * 8)) {
                  pVVar8[lVar16] = lVar4;
                  lVar16 = lVar16 + 1;
                  lVar17 = lVar17 + 1;
                }
                else {
                  pVVar10[EVar23] = lVar4;
                  EVar23 = EVar23 + 1;
                  lVar15 = lVar15 + 1;
                }
                EVar24 = EVar24 + 1;
              } while (EVar24 < lVar20);
            }
            lVar19 = lVar19 + 1;
            pEVar7[lVar19] = lVar16;
            pEVar9[lVar19] = EVar23;
            EVar24 = lVar20;
          } while (lVar19 != lVar6);
        }
        goto LAB_00103e8d;
      }
    }
  }
  lVar15 = 0;
  *pEVar7 = 0;
  *pEVar9 = 0;
  lVar17 = 0;
LAB_00103e8d:
  (__return_storage_ptr__->outlist).nVertices = uVar1;
  (__return_storage_ptr__->outlist).nEdges = lVar17;
  (__return_storage_ptr__->outlist).offsets = pEVar7;
  (__return_storage_ptr__->outlist).nbors = pVVar8;
  (__return_storage_ptr__->inlist).nVertices = uVar1;
  (__return_storage_ptr__->inlist).nEdges = lVar15;
  (__return_storage_ptr__->inlist).offsets = pEVar9;
  (__return_storage_ptr__->inlist).nbors = pVVar10;
  operator_delete__(pvVar11);
  operator_delete__(__first);
  operator_delete__(pvVar12);
  operator_delete__(pvVar13);
  operator_delete__(__s);
  operator_delete__(pvVar14);
  return __return_storage_ptr__;
}

Assistant:

CDAG degenOrdered(CGraph *g) {
    CDAG ret;     // CDAG to be returned
    CGraph outdag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                     new VertexIdx[g->nEdges + 1]};  // Initialize DAG of out-edges
    CGraph indag = {g->nVertices, 0, new EdgeIdx[g->nVertices + 1],
                    new VertexIdx[g->nEdges + 1]};   // Initialize DAG of in-edges
    EdgeIdx outcur = 0;
    EdgeIdx incur = 0;
    VertexIdx *removal_time = new VertexIdx[g->nVertices]; // array of removal times
    VertexIdx *verts_by_deg = new VertexIdx[g->nVertices]; // array of vertices, sorted by current degree
    VertexIdx *degrees = new VertexIdx[g->nVertices]; // array of degrees
    VertexIdx *vert_ptrs = new VertexIdx[g->nVertices]; // array of vertex pointers, that point into verts_by_deg
    VertexIdx *deg_ptrs = new VertexIdx[g->nVertices +
                                        1]; // array of degree pointers, pointing into verts_by_deg. deg_ptrs[deg] will point to the first vertex in vert_by_deg with degree deg
    bool *is_removed = new bool[g->nVertices]; // to keep track of whether vertex was removed

    //first, set up a sorted list of vertices by degree
    for (VertexIdx i = 0; i < g->nVertices; i++) // looping over vertices
    {
        verts_by_deg[i] = i; //initializing verts_by_deg to store all vertex labels
        is_removed[i] = false; //intiailizing is_removed to all false
        degrees[i] = g->offsets[i + 1] - g->offsets[i]; // storing the degree of vertex i
    }

    std::sort(verts_by_deg, verts_by_deg + g->nVertices, DegreeComp(g)); // sort all the vertices by degree
    // set up vertex pointers
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over verts_by_deg
        vert_ptrs[verts_by_deg[i]] = i; // the vertex verts_by_deg[i] is a position i

    //now set up degree pointers
    VertexIdx current_vert = verts_by_deg[0]; //initialize current vertex to smallest degree vertex
    VertexIdx min_deg =
            g->offsets[current_vert + 1] - g->offsets[current_vert]; //initialize running degree to lowest degree
    for (VertexIdx deg = 0; deg < g->nVertices; deg++) //looping over degrees
        deg_ptrs[deg] = -1; // initialize these pointers to -1
    deg_ptrs[min_deg] = 0; // initialize the pointer for minimum degree to beginning on array

    VertexIdx current_deg, running_deg; // we will need this variables while looping
    running_deg = min_deg; //initialize the running degree to the minimum degree
    for (VertexIdx i = 0; i < g->nVertices; i++) //looping over vertices
    {
        current_vert = verts_by_deg[i]; // the ith vertex in sorted list by degree
        current_deg = g->offsets[current_vert + 1] - g->offsets[current_vert]; // get degree of current vertex
        if (current_deg == running_deg) // the current degree is same as running degree, so we move to next vertex
            continue;
        // current_deg is larger, so we need to set pointer in deg_ptrs
        deg_ptrs[current_deg] = i; // the first vertex with current_deg is at location i
        running_deg = current_deg; //update the running degree
    }

    // at this point, we have set up verts_by_deg and deg_ptrs. Now we begin the actual removal of vertices
    VertexIdx to_remove, nbr, swap, next; // convenient variables used in next loop
    for (VertexIdx time = 0;
         time < g->nVertices; time++) // a loop to remove all vertices, with loop variable being the "time"
    {
        to_remove = verts_by_deg[deg_ptrs[min_deg]]; // remove the vertex of minimum degree
        removal_time[to_remove] = time; // set removal time of vertex
        is_removed[to_remove] = true; // remove this vertex

//         printf("Removed %lld, min deg = %lld, position = %lld\n",to_remove,min_deg,deg_ptrs[min_deg]); //(for debug)
//         if (time == g->nVertices-1) // last vertex removed
//             break; // just exit. This is to prevent possible pointer/off-by-1 issues in the remaining code

        next = verts_by_deg[deg_ptrs[min_deg] + 1]; // the next vertex in the current ordering of degree
        verts_by_deg[deg_ptrs[min_deg]] = -1; // remove vertex from array
        if (degrees[next] != degrees[to_remove]) // next has higher degree
        {
            deg_ptrs[min_deg] = -1; // there is no vertex of degree min_deg
            min_deg = degrees[next]; //update minimum degree
        } else //next vertex has same degree, so only need to increment pointer
            deg_ptrs[min_deg]++; // increment degree pointer for minimum degree, since first vertex is removed

        for (VertexIdx j = g->offsets[to_remove];
             j < g->offsets[to_remove + 1]; j++) // loop over neighbors of removed vertex
        {
            nbr = g->nbors[j]; // looking at the neighbor
            if (is_removed[nbr]) // if neighbor is removed, move to next neighbor
                continue;
//             for (VertexIdx ind=0; ind < g->nVertices; ind++) FOR DEBUG
//                 printf("%lld ",verts_by_deg[ind]);
//             printf("Moving %lld from %lld to %lld\n",nbr,vert_ptrs[nbr],deg_ptrs[degrees[nbr]]);

            swap = verts_by_deg[deg_ptrs[degrees[nbr]]]; //vertex to be swapped with nbr
            if (swap == -1) // some problem, swapping with deleted vertex
            {
                printf("Error in degeneracy removal. Swapping with removed vertex\n nbr = %lld, deg_ptrs[degrees[nbr]] = %lld",
                       nbr, deg_ptrs[degrees[nbr]]);
                exit(EXIT_FAILURE);
            }
            verts_by_deg[deg_ptrs[degrees[nbr]]] = nbr; //place nbr at beginning of list of vertices of its degree
            verts_by_deg[vert_ptrs[nbr]] = swap; //place swapped vertex at location of nbr

            vert_ptrs[swap] = vert_ptrs[nbr]; // update position of swapped vertex
            vert_ptrs[nbr] = deg_ptrs[degrees[nbr]]; // update position of nbr

            if (degrees[verts_by_deg[deg_ptrs[degrees[nbr]] + 1]] ==
                degrees[nbr]) // if next vertex in verts_by_deg after nbr has same degree
                deg_ptrs[degrees[nbr]]++; //increment degree pointer for vertices of degree of nbr, since nbr's degree will be decremented
            else // next vertex has higher degree
                deg_ptrs[degrees[nbr]] = -1; // no more vertices of that degree
            degrees[nbr]--; //decrement degree of neighbor
            if (deg_ptrs[degrees[nbr]] == -1) // if there was no vertex with the same degree as nbr
                deg_ptrs[degrees[nbr]] = vert_ptrs[nbr]; // set the degree pointer to current position of nbr

            if (min_deg > degrees[nbr]) // update minimum degree, if needed
                min_deg = degrees[nbr];
        }
    }

    //sanity check; make sure all vertices are removed
    for (VertexIdx i = 0; i < g->nVertices; i++) {
        if (!is_removed[i]) // i was not removed
        {
            printf("Error in degeneracy removal. Vertex %lld not removed\n", i);
            exit(EXIT_FAILURE);
        }
    }

    //now we build the DAG
    outdag.offsets[0] = 0;
    indag.offsets[0] = 0;
    VertexIdx dest;
    outcur = 0;
    incur = 0;

    for (VertexIdx i = 0; i < g->nVertices; ++i)   // Looping over all vertices in g
    {
        for (EdgeIdx j = g->offsets[i]; j < g->offsets[i + 1]; ++j)   // Looping over neighbors of i in g
        {
            dest = g->nbors[j];     // We are now looking at edge (i,dest)

            //We now orient the edge depending of removal times
            // In the output, the g-edge (i,dest) is either pointing to dest (in if condition) or pointing to i (in else condition).

            if (removal_time[i] < removal_time[dest]) // i was removed before dest
            {
                outdag.nbors[outcur] = dest;   // We want point edge from i to dest. So this directed edge is added to outdag.
                ++outcur;                      // Increment pointer in outdag.nbors and the number of edges in outdag.
                ++outdag.nEdges;
            } else {
                indag.nbors[incur] = dest;     // We point edge from dest to i. So this edge goes into indag.
                ++incur;                       // Pointer and number of edges incremented
                ++indag.nEdges;
            }
        }
        outdag.offsets[i +
                       1] = outcur;         // We have finished all edges incident to i, so we can update offsets in DAGs.
        indag.offsets[i + 1] = incur;
    }

    ret.outlist = outdag;
    ret.inlist = indag;

    // free memory
    delete[] removal_time;
    delete[] verts_by_deg;
    delete[] degrees;
    delete[] vert_ptrs;
    delete[] deg_ptrs;
    delete[] is_removed;

    return ret;
}